

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comoment_suite.cpp
# Opt level: O0

void double_4_suite::test_same_no_increment(void)

{
  undefined8 local_118;
  value_type local_110 [2];
  undefined8 local_100;
  value_type local_f8 [2];
  undefined8 local_e8;
  value_type local_e0 [2];
  undefined8 local_d0;
  value_type local_c8 [2];
  undefined8 local_b8;
  value_type local_b0 [2];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined8 local_88;
  value_type local_80 [2];
  undefined8 local_70;
  value_type local_68 [2];
  undefined1 local_58 [8];
  covariance<double,_4> filter;
  
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::basic_comoment
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_68[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_70 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x7b,"void double_4_suite::test_same_no_increment()",local_68,&local_70);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_80[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_88 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x7e,"void double_4_suite::test_same_no_increment()",local_80,&local_88);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_98[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_a0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x81,"void double_4_suite::test_same_no_increment()",local_98,&local_a0);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_b0[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_b8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x84,"void double_4_suite::test_same_no_increment()",local_b0,&local_b8);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_c8[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_d0 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x88,"void double_4_suite::test_same_no_increment()",local_c8,&local_d0);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_e0[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_e8 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x8b,"void double_4_suite::test_same_no_increment()",local_e0,&local_e8);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_f8[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_100 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x8e,"void double_4_suite::test_same_no_increment()",local_f8,&local_100);
  trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::push
            ((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58,2.0,2.0);
  local_110[0] = trial::online::interim::basic_comoment<double,_4UL,_(trial::online::with)2>::
                 variance((basic_comoment<double,_4UL,_(trial::online::with)2> *)local_58);
  local_118 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/comoment_suite.cpp"
             ,0x91,"void double_4_suite::test_same_no_increment()",local_110,&local_118);
  return;
}

Assistant:

void test_same_no_increment()
{
    interim::covariance<double, 4> filter;

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    // Window full
    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);

    filter.push(2.0, 2.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
}